

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *pVVar8;
  char *__s;
  ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *pVVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  allocator<char> local_441;
  string local_440;
  float local_41c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  segy_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  csv_files;
  char *local_3d8;
  CombinedSeismogramm<float,_2> s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  char segy_file [200];
  char csv_file [200];
  option long_opt [7];
  
  memcpy(csv_file,"csv_file",200);
  memcpy(segy_file,"segy_file",200);
  _opterr = 0;
  memcpy(long_opt,&PTR_anon_var_dwarf_5e30_00111bb0,0xe0);
  local_3d8 = "tosegy";
  uVar3 = 2;
  local_41c = 1.0;
  do {
    do {
      uVar2 = getopt_long(argc,argv,"hc:d:f:s:i:",long_opt,0);
      pcVar5 = _optarg;
    } while (uVar2 == 0);
    switch(uVar2) {
    case 99:
      local_3d8 = _optarg;
      break;
    case 100:
      uVar3 = atoi(_optarg);
      break;
    case 0x65:
    case 0x67:
      goto switchD_001075d1_caseD_65;
    case 0x66:
      pcVar7 = csv_file;
      goto LAB_0010761c;
    case 0x68:
      printf("Usage: %s [OPTIONS]\n",*argv);
      puts(
          "  Option                  |  Description                                       | Default "
          );
      puts(
          "  -c, --convertion          \"tosegy\" or \"tocsv\"                                  tosegy"
          );
      puts("  -d, --dims                number of dimmensions: 2 or 3                        2");
      puts(
          "  -s, --segyfile            .segy file (without _x.segy at the end)              segy_file"
          );
      puts(
          "  -f, --csvfile             .csv file (without .csv extension at the end)        csv_file"
          );
      puts("  -i, --interpolation_coef  time interpolation coefficient                       1.0");
      puts("  -h, --help                print this help and exit");
      printf("Example: %s --segyfile seismo --csvfile input\n",*argv);
      putchar(10);
      return 0;
    case 0x69:
      dVar1 = atof(_optarg);
      local_41c = (float)dVar1;
      break;
    default:
      if (uVar2 == 0xffffffff) {
        if (uVar3 - 4 < 0xfffffffe) {
          fprintf(_stderr,
                  "Invalid value for option dims (should be equal to 2 or 3, but equal to %d)\n",
                  (ulong)uVar3);
        }
        else {
          iVar4 = strcmp(local_3d8,"tosegy");
          if ((iVar4 == 0) || (iVar4 = strcmp(local_3d8,"tocsv"), iVar4 == 0)) {
            pcVar5 = strdup(segy_file);
            sVar6 = strlen(pcVar5);
            builtin_strncpy(pcVar5 + sVar6,"_x.segy",8);
            pcVar7 = strdup(segy_file);
            sVar6 = strlen(pcVar7);
            builtin_strncpy(pcVar7 + sVar6,"_y.segy",8);
            if (uVar3 != 2) {
              __s = strdup(segy_file);
              sVar6 = strlen(__s);
              builtin_strncpy(__s + sVar6,"_z.segy",8);
              s.seismogramms.
              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              s.seismogramms.
              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              s.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              s.seismogramms.
              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              s.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              s.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              s.interpolation_multiplier = local_41c;
              s.componentInfos.
              super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              s.componentInfos.
              super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              s.componentInfos.
              super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_440,pcVar5,(allocator<char> *)&csv_files);
              pVVar9 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
              pVVar9->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00111d10;
              CombinedSeismogramm<float,_3>::AddComponent
                        ((CombinedSeismogramm<float,_3> *)&s,&local_440,pVVar9);
              std::__cxx11::string::~string((string *)&local_440);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_440,pcVar7,(allocator<char> *)&csv_files);
              pVVar9 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
              pVVar9->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00111d50;
              CombinedSeismogramm<float,_3>::AddComponent
                        ((CombinedSeismogramm<float,_3> *)&s,&local_440,pVVar9);
              std::__cxx11::string::~string((string *)&local_440);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_440,__s,(allocator<char> *)&csv_files);
              pVVar9 = (ValueGetter<CombinedSeismogramm<float,_3>::Elastic,_3> *)operator_new(8);
              pVVar9->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00111d80;
              CombinedSeismogramm<float,_3>::AddComponent
                        ((CombinedSeismogramm<float,_3> *)&s,&local_440,pVVar9);
              std::__cxx11::string::~string((string *)&local_440);
              csv_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              csv_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              csv_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_440,csv_file,(allocator<char> *)&segy_files);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &csv_files,&local_440);
              std::__cxx11::string::~string((string *)&local_440);
              segy_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              segy_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              segy_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_440,pcVar5,&local_441);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &segy_files,&local_440);
              std::__cxx11::string::~string((string *)&local_440);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_440,pcVar7,&local_441);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &segy_files,&local_440);
              std::__cxx11::string::~string((string *)&local_440);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_440,__s,&local_441);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &segy_files,&local_440);
              std::__cxx11::string::~string((string *)&local_440);
              iVar4 = strcmp(local_3d8,"tosegy");
              if (iVar4 == 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_360,&csv_files);
                CombinedSeismogramm<float,_3>::Load
                          ((CombinedSeismogramm<float,_3> *)&s,CSV,&local_360);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_360);
                pvVar10 = &local_300;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(pvVar10,&segy_files);
                CombinedSeismogramm<float,_3>::Save
                          ((CombinedSeismogramm<float,_3> *)&s,SEG_Y,pvVar10);
              }
              else {
                iVar4 = strcmp(local_3d8,"tocsv");
                if (iVar4 != 0) goto LAB_00107d21;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_378,&segy_files);
                CombinedSeismogramm<float,_3>::Load
                          ((CombinedSeismogramm<float,_3> *)&s,SEG_Y,&local_378);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_378);
                pvVar10 = &local_318;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(pvVar10,&csv_files);
                CombinedSeismogramm<float,_3>::Save((CombinedSeismogramm<float,_3> *)&s,CSV,pvVar10)
                ;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(pvVar10);
LAB_00107d21:
              free(pcVar5);
              free(pcVar7);
              free(__s);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&segy_files);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&csv_files);
              CombinedSeismogramm<float,_3>::~CombinedSeismogramm
                        ((CombinedSeismogramm<float,_3> *)&s);
              return 0;
            }
            s.seismogramms.
            super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            s.seismogramms.
            super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            s.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            s.seismogramms.
            super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            s.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            s.times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            s.interpolation_multiplier = local_41c;
            s.componentInfos.
            super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            s.componentInfos.
            super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            s.componentInfos.
            super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_440,pcVar5,(allocator<char> *)&csv_files);
            pVVar8 = (ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)operator_new(8);
            pVVar8->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00111ca0;
            CombinedSeismogramm<float,_2>::AddComponent(&s,&local_440,pVVar8);
            std::__cxx11::string::~string((string *)&local_440);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_440,pcVar7,(allocator<char> *)&csv_files);
            pVVar8 = (ValueGetter<CombinedSeismogramm<float,_2>::Elastic,_2> *)operator_new(8);
            pVVar8->_vptr_ValueGetter = (_func_int **)&PTR_GetValue_00111ce0;
            CombinedSeismogramm<float,_2>::AddComponent(&s,&local_440,pVVar8);
            std::__cxx11::string::~string((string *)&local_440);
            csv_files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            csv_files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            csv_files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_440,csv_file,(allocator<char> *)&segy_files);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &csv_files,&local_440);
            std::__cxx11::string::~string((string *)&local_440);
            segy_files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            segy_files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            segy_files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_440,pcVar5,&local_441);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &segy_files,&local_440);
            std::__cxx11::string::~string((string *)&local_440);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_440,pcVar7,&local_441);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &segy_files,&local_440);
            std::__cxx11::string::~string((string *)&local_440);
            iVar4 = strcmp(local_3d8,"tosegy");
            if (iVar4 == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_330,&csv_files);
              CombinedSeismogramm<float,_2>::Load(&s,CSV,&local_330);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_330);
              pvVar10 = &local_2d0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(pvVar10,&segy_files);
              CombinedSeismogramm<float,_2>::Save(&s,SEG_Y,pvVar10);
            }
            else {
              iVar4 = strcmp(local_3d8,"tocsv");
              if (iVar4 != 0) goto LAB_00107c85;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_348,&segy_files);
              CombinedSeismogramm<float,_2>::Load(&s,SEG_Y,&local_348);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_348);
              pvVar10 = &local_2e8;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(pvVar10,&csv_files);
              CombinedSeismogramm<float,_2>::Save(&s,CSV,pvVar10);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(pvVar10);
LAB_00107c85:
            free(pcVar5);
            free(pcVar7);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&segy_files);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&csv_files);
            CombinedSeismogramm<float,_2>::~CombinedSeismogramm(&s);
            return 0;
          }
          fprintf(_stderr,
                  "Invalid value for option convertion (should be equal to \"tosegy\" or \"tocsv\", but equal to %s)\n"
                  ,local_3d8);
        }
        goto LAB_00107db8;
      }
      if (uVar2 != 0x73) {
        if ((uVar2 == 0x3a) || (uVar2 == 0x3f)) goto LAB_00107db8;
switchD_001075d1_caseD_65:
        fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)uVar2);
LAB_00107db8:
        fprintf(_stderr,"Try `%s --help\' for more information.\n",*argv);
        return -2;
      }
      pcVar7 = segy_file;
LAB_0010761c:
      strcpy(pcVar7,_optarg);
    }
    printf("you entered \"%s\"\n",pcVar5);
  } while( true );
}

Assistant:

int main(int argc, char ** argv)
{
    char * convertion = "tosegy";
    int dims = 2;
    char csv_file[MAX_NAME_LENGTH] = "csv_file";
    char segy_file[MAX_NAME_LENGTH] = "segy_file";
    float interpolation_coef = 1.0;

    int c;
    opterr = 0;

    const char    * short_opt = "hc:d:f:s:i:";
    struct option   long_opt[] =
    {
        {"help",          no_argument,       NULL, 'h'},
        {"convertion",    required_argument, NULL, 'c'},
        {"dims",          required_argument, NULL, 'd'},
        {"csvfile",       required_argument, NULL, 'f'},
        {"segyfile",      required_argument, NULL, 's'},
        {"interpolation_coef",      required_argument, NULL, 'i'},
        {NULL,            0,                 NULL, 0  }
    };

    while((c = getopt_long(argc, argv, short_opt, long_opt, NULL)) != -1)
    {
        switch(c)
        {
            case -1:       /* no more arguments */
            case 0:        /* long options toggles */
            break;

            case 'c':
            convertion = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'd':
            dims = ::atoi(optarg);
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'f':
            strcpy(csv_file, optarg);
            //csv_file = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 's':
            strcpy(segy_file, optarg);
            //segy_file = optarg;
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'i':
            interpolation_coef = ::atof(optarg);
            printf("you entered \"%s\"\n", optarg);
            break;

            case 'h':
            printf("Usage: %s [OPTIONS]\n", argv[0]);
            printf("  Option                  |  Description                                       | Default \n");
            printf("  -c, --convertion          \"tosegy\" or \"tocsv\"                                  tosegy\n");
            printf("  -d, --dims                number of dimmensions: 2 or 3                        2\n");
            printf("  -s, --segyfile            .segy file (without _x.segy at the end)              segy_file\n");
            printf("  -f, --csvfile             .csv file (without .csv extension at the end)        csv_file\n");
            printf("  -i, --interpolation_coef  time interpolation coefficient                       1.0\n");
            printf("  -h, --help                print this help and exit\n");
            printf("Example: %s --segyfile seismo --csvfile input\n", argv[0]);
            printf("\n");
            return(0);

            case ':':
            case '?':
            fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
            return(-2);

            default:
            fprintf(stderr, "%s: invalid option -- %c\n", argv[0], c);
            fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
            return(-2);
        };
    };
    if (dims != 2 && dims != 3)
    {
        fprintf(stderr, "Invalid value for option dims (should be equal to 2 or 3, but equal to %d)\n", dims);
        fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
        return(-2);
    }
    if (strcmp(convertion,"tosegy") != 0 && strcmp(convertion,"tocsv") != 0 )
    {
        fprintf(stderr, "Invalid value for option convertion (should be equal to \"tosegy\" or \"tocsv\", but equal to %s)\n", convertion);
        fprintf(stderr, "Try `%s --help' for more information.\n", argv[0]);
        return(-2);
    }

    if (dims == 2)
    {
        char * segy_file_x = strdup(segy_file);
        strcat(segy_file_x, "_x.segy");
        char * segy_file_y = strdup(segy_file);
        strcat(segy_file_y, "_y.segy");
        typedef CombinedSeismogramm<float, 2>::Elastic SeismoElastic;
        CombinedSeismogramm < float, 2 > s = CombinedSeismogramm < float, 2 >(interpolation_coef);
        s.AddComponent(segy_file_x, new VxGetter<SeismoElastic, 2>());
        s.AddComponent(segy_file_y, new VyGetter<SeismoElastic, 2>());

        std::vector<std::string> csv_files;
        csv_files.push_back(csv_file);


        std::vector<std::string> segy_files;
        segy_files.push_back(segy_file_x);
        segy_files.push_back(segy_file_y);

        if (!strcmp(convertion,"tosegy"))
        {
            s.Load(CSV, csv_files);
            s.Save(SEG_Y, segy_files);
        }
        else if (!strcmp(convertion,"tocsv"))
        {
            s.Load(SEG_Y, segy_files);
            s.Save(CSV, csv_files);
        }
        free(segy_file_x);
        free(segy_file_y);
    }
    else if (dims == 3)
    {
        char * segy_file_x = strdup(segy_file);
        strcat(segy_file_x, "_x.segy");
        char * segy_file_y = strdup(segy_file);
        strcat(segy_file_y, "_y.segy");
        char * segy_file_z = strdup(segy_file);
        strcat(segy_file_z, "_z.segy");
        typedef CombinedSeismogramm<float, 3>::Elastic SeismoElastic;
        CombinedSeismogramm < float, 3 > s = CombinedSeismogramm < float, 3 >(interpolation_coef);
        s.AddComponent(segy_file_x, new VxGetter<SeismoElastic, 3>());
        s.AddComponent(segy_file_y, new VyGetter<SeismoElastic, 3>());
        s.AddComponent(segy_file_z, new VzGetter<SeismoElastic, 3>());

        std::vector<std::string> csv_files;
        csv_files.push_back(csv_file);


        std::vector<std::string> segy_files;
        segy_files.push_back(segy_file_x);
        segy_files.push_back(segy_file_y);
        segy_files.push_back(segy_file_z);

        if (!strcmp(convertion,"tosegy"))
        {
            s.Load(CSV, csv_files);
            s.Save(SEG_Y, segy_files);
        }
        else if (!strcmp(convertion,"tocsv"))
        {
            s.Load(SEG_Y, segy_files);
            s.Save(CSV, csv_files);
        }
        free(segy_file_x);
        free(segy_file_y);
        free(segy_file_z);
    }
    return 0;
}